

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

QString * __thiscall QFileInfo::group(QFileInfo *this)

{
  QFileInfoPrivate *pQVar1;
  QString *in_RDI;
  QLatin1StringView QVar2;
  QLatin1StringView in_stack_00000000;
  FileOwner in_stack_00000014;
  QFileInfoPrivate *in_stack_00000018;
  QFileInfoPrivate *d;
  char *in_stack_ffffffffffffffd8;
  
  pQVar1 = d_func((QFileInfo *)0x2adb78);
  if ((*(uint *)&pQVar1->field_0x1d8 >> 0x1e & 1) == 0) {
    QFileInfoPrivate::getFileOwner(in_stack_00000018,in_stack_00000014);
  }
  else {
    QVar2 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffd8,(size_t)in_RDI);
    QString::QString((QString *)QVar2.m_data,in_stack_00000000);
  }
  return in_RDI;
}

Assistant:

QString QFileInfo::group() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    return d->getFileOwner(QAbstractFileEngine::OwnerGroup);
}